

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utRemoveComponent.cpp
# Opt level: O0

void __thiscall
RemoveVCProcessTest_testTextureRemove_Test::TestBody
          (RemoveVCProcessTest_testTextureRemove_Test *this)

{
  RemoveVCProcess *pRVar1;
  bool bVar2;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_b8;
  Message local_b0;
  uint local_a4;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  Message local_88;
  uint local_7c;
  undefined1 local_78 [8];
  AssertionResult gtest_ar;
  AssertHelper local_48;
  Message local_40 [3];
  bool local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar_;
  RemoveVCProcessTest_testTextureRemove_Test *this_local;
  
  gtest_ar_.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this;
  Assimp::RemoveVCProcess::SetDeleteFlags((this->super_RemoveVCProcessTest).piProcess,0x80);
  pRVar1 = (this->super_RemoveVCProcessTest).piProcess;
  (*(pRVar1->super_BaseProcess)._vptr_BaseProcess[5])
            (pRVar1,(this->super_RemoveVCProcessTest).pScene);
  local_21 = ((this->super_RemoveVCProcessTest).pScene)->mTextures == (aiTexture **)0x0;
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_20,&local_21,(type *)0x0)
  ;
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar2) {
    testing::Message::Message(local_40);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar.message_,(internal *)local_20,
               (AssertionResult *)"NULL == pScene->mTextures","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0xa1,pcVar3);
    testing::internal::AssertHelper::operator=(&local_48,local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    std::__cxx11::string::~string((string *)&gtest_ar.message_);
    testing::Message::~Message(local_40);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_7c = 0;
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_int>
            ((char *)local_78,"0U",(uint *)"pScene->mNumTextures",&local_7c,
             &((this->super_RemoveVCProcessTest).pScene)->mNumTextures);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar2) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_78);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0xa2,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  local_a4 = 0;
  testing::internal::EqHelper<true>::Compare<unsigned_int,unsigned_int>
            ((char *)local_a0,"0U",(uint *)"pScene->mFlags",&local_a4,
             (this->super_RemoveVCProcessTest).pScene);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar2) {
    testing::Message::Message(&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/test/unit/utRemoveComponent.cpp"
               ,0xa3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  return;
}

Assistant:

TEST_F(RemoveVCProcessTest, testTextureRemove)
{
    piProcess->SetDeleteFlags(aiComponent_TEXTURES);
    piProcess->Execute(pScene);

    EXPECT_TRUE(NULL == pScene->mTextures);
    EXPECT_EQ(0U, pScene->mNumTextures);
    EXPECT_EQ(0U, pScene->mFlags);
}